

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpecParser::addPattern<Catch::TestSpec::TagPattern>(TestSpecParser *this)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  TagPattern *this_00;
  ExcludedPattern *this_01;
  Ptr<Catch::TestSpec::Pattern> local_f8;
  Ptr<Catch::TestSpec::Pattern> pattern;
  allocator local_c9;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ulong local_38;
  size_t i;
  string token;
  TestSpecParser *this_local;
  
  token.field_2._8_8_ = this;
  subString_abi_cxx11_((string *)&i,this);
  for (local_38 = 0; uVar3 = local_38,
      sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_escapeChars)
      , uVar3 < sVar2; local_38 = local_38 + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              (&this->m_escapeChars,local_38);
    std::__cxx11::string::substr((ulong)&local_78,(ulong)&i);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              (&this->m_escapeChars,local_38);
    std::__cxx11::string::substr((ulong)&local_a8,(ulong)&i);
    std::operator+(&local_58,&local_78,&local_a8);
    std::__cxx11::string::operator=((string *)&i,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->m_escapeChars);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"exclude:",&local_c9);
  bVar1 = startsWith((string *)&i,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  if (bVar1) {
    this->m_exclusion = true;
    std::__cxx11::string::substr((ulong)&pattern,(ulong)&i);
    std::__cxx11::string::operator=((string *)&i,(string *)&pattern);
    std::__cxx11::string::~string((string *)&pattern);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    this_00 = (TagPattern *)operator_new(0x30);
    TestSpec::TagPattern::TagPattern(this_00,(string *)&i);
    Ptr<Catch::TestSpec::Pattern>::Ptr(&local_f8,(Pattern *)this_00);
    if ((this->m_exclusion & 1U) != 0) {
      this_01 = (ExcludedPattern *)operator_new(0x18);
      TestSpec::ExcludedPattern::ExcludedPattern(this_01,&local_f8);
      Ptr<Catch::TestSpec::Pattern>::operator=(&local_f8,(Pattern *)this_01);
    }
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(&(this->m_currentFilter).m_patterns,&local_f8);
    Ptr<Catch::TestSpec::Pattern>::~Ptr(&local_f8);
  }
  this->m_exclusion = false;
  this->m_mode = None;
  std::__cxx11::string::~string((string *)&i);
  return;
}

Assistant:

void addPattern() {
            std::string token = subString();
            for( size_t i = 0; i < m_escapeChars.size(); ++i )
                token = token.substr( 0, m_escapeChars[i]-m_start-i ) + token.substr( m_escapeChars[i]-m_start-i+1 );
            m_escapeChars.clear();
            if( startsWith( token, "exclude:" ) ) {
                m_exclusion = true;
                token = token.substr( 8 );
            }
            if( !token.empty() ) {
                Ptr<TestSpec::Pattern> pattern = new T( token );
                if( m_exclusion )
                    pattern = new TestSpec::ExcludedPattern( pattern );
                m_currentFilter.m_patterns.push_back( pattern );
            }
            m_exclusion = false;
            m_mode = None;
        }